

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanio.c
# Opt level: O1

Abc_Obj_t * Abc_ObjInsertBetween(Abc_Obj_t *pNodeIn,Abc_Obj_t *pNodeOut,Abc_ObjType_t Type)

{
  int iVar1;
  int iVar2;
  Mem_Step_t *pMVar3;
  int *piVar4;
  long lVar5;
  Abc_Obj_t *pAVar6;
  int *piVar7;
  char *pcVar8;
  long lVar9;
  uint uVar10;
  char *__format;
  uint uVar11;
  
  lVar5 = (long)(pNodeIn->vFanouts).nSize;
  uVar10 = 0xffffffff;
  if (0 < lVar5) {
    lVar9 = 0;
    do {
      if ((pNodeIn->vFanouts).pArray[lVar9] == pNodeOut->Id) {
        uVar10 = (uint)lVar9;
        break;
      }
      lVar9 = lVar9 + 1;
    } while (lVar5 != lVar9);
  }
  if (uVar10 == 0xffffffff) {
    pcVar8 = Abc_ObjName(pNodeOut);
    printf("Node %s is not among",pcVar8);
    pcVar8 = Abc_ObjName(pNodeIn);
    __format = " the fanouts of node %s...\n";
  }
  else {
    lVar5 = (long)(pNodeOut->vFanins).nSize;
    uVar11 = 0xffffffff;
    if (0 < lVar5) {
      lVar9 = 0;
      do {
        if ((pNodeOut->vFanins).pArray[lVar9] == pNodeIn->Id) {
          uVar11 = (uint)lVar9;
          break;
        }
        lVar9 = lVar9 + 1;
      } while (lVar5 != lVar9);
    }
    if (uVar11 != 0xffffffff) {
      pAVar6 = Abc_NtkCreateObj(pNodeIn->pNtk,Type);
      iVar1 = pNodeIn->Id;
      iVar2 = (pAVar6->vFanins).nSize;
      if (iVar2 == (pAVar6->vFanins).nCap) {
        pMVar3 = pAVar6->pNtk->pMmStep;
        if (iVar2 == 0) {
          (pAVar6->vFanins).nCap = 1;
        }
        iVar2 = (pAVar6->vFanins).nCap;
        if (pMVar3 == (Mem_Step_t *)0x0) {
          piVar7 = (int *)malloc((long)iVar2 << 3);
        }
        else {
          piVar7 = (int *)Mem_StepEntryFetch(pMVar3,iVar2 << 3);
        }
        piVar4 = (pAVar6->vFanins).pArray;
        if (piVar4 != (int *)0x0) {
          if (0 < (pAVar6->vFanins).nSize) {
            lVar5 = 0;
            do {
              piVar7[lVar5] = piVar4[lVar5];
              lVar5 = lVar5 + 1;
            } while (lVar5 < (pAVar6->vFanins).nSize);
          }
          if (pMVar3 == (Mem_Step_t *)0x0) {
            free(piVar4);
            (pAVar6->vFanins).pArray = (int *)0x0;
          }
          else {
            Mem_StepEntryRecycle(pMVar3,(char *)piVar4,(pAVar6->vFanins).nCap << 2);
          }
        }
        (pAVar6->vFanins).nCap = (pAVar6->vFanins).nCap << 1;
        (pAVar6->vFanins).pArray = piVar7;
      }
      iVar2 = (pAVar6->vFanins).nSize;
      (pAVar6->vFanins).nSize = iVar2 + 1;
      (pAVar6->vFanins).pArray[iVar2] = iVar1;
      iVar1 = pNodeOut->Id;
      iVar2 = (pAVar6->vFanouts).nSize;
      if (iVar2 == (pAVar6->vFanouts).nCap) {
        pMVar3 = pAVar6->pNtk->pMmStep;
        if (iVar2 == 0) {
          (pAVar6->vFanouts).nCap = 1;
        }
        iVar2 = (pAVar6->vFanouts).nCap;
        if (pMVar3 == (Mem_Step_t *)0x0) {
          piVar7 = (int *)malloc((long)iVar2 << 3);
        }
        else {
          piVar7 = (int *)Mem_StepEntryFetch(pMVar3,iVar2 << 3);
        }
        piVar4 = (pAVar6->vFanouts).pArray;
        if (piVar4 != (int *)0x0) {
          if (0 < (pAVar6->vFanouts).nSize) {
            lVar5 = 0;
            do {
              piVar7[lVar5] = piVar4[lVar5];
              lVar5 = lVar5 + 1;
            } while (lVar5 < (pAVar6->vFanouts).nSize);
          }
          if (pMVar3 == (Mem_Step_t *)0x0) {
            free(piVar4);
            (pAVar6->vFanouts).pArray = (int *)0x0;
          }
          else {
            Mem_StepEntryRecycle(pMVar3,(char *)piVar4,(pAVar6->vFanouts).nCap << 2);
          }
        }
        (pAVar6->vFanouts).nCap = (pAVar6->vFanouts).nCap << 1;
        (pAVar6->vFanouts).pArray = piVar7;
      }
      iVar2 = (pAVar6->vFanouts).nSize;
      (pAVar6->vFanouts).nSize = iVar2 + 1;
      (pAVar6->vFanouts).pArray[iVar2] = iVar1;
      if ((((-1 < (int)uVar10) && ((int)uVar10 < (pNodeIn->vFanouts).nSize)) &&
          ((pNodeIn->vFanouts).pArray[uVar10] = pAVar6->Id, -1 < (int)uVar11)) &&
         ((int)uVar11 < (pNodeOut->vFanins).nSize)) {
        (pNodeOut->vFanins).pArray[uVar11] = pAVar6->Id;
        return pAVar6;
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    pcVar8 = Abc_ObjName(pNodeIn);
    printf("Node %s is not among",pcVar8);
    pcVar8 = Abc_ObjName(pNodeOut);
    __format = " the fanins of node %s...\n";
  }
  printf(__format,pcVar8);
  return (Abc_Obj_t *)0x0;
}

Assistant:

Abc_Obj_t * Abc_ObjInsertBetween( Abc_Obj_t * pNodeIn, Abc_Obj_t * pNodeOut, Abc_ObjType_t Type )
{
    Abc_Obj_t * pNodeNew;
    int iFanoutIndex, iFaninIndex;
    // find pNodeOut among the fanouts of pNodeIn
    if ( (iFanoutIndex = Vec_IntFind( &pNodeIn->vFanouts, pNodeOut->Id )) == -1 )
    {
        printf( "Node %s is not among", Abc_ObjName(pNodeOut) );
        printf( " the fanouts of node %s...\n", Abc_ObjName(pNodeIn) );
        return NULL;
    }
    // find pNodeIn among the fanins of pNodeOut
    if ( (iFaninIndex = Vec_IntFind( &pNodeOut->vFanins, pNodeIn->Id )) == -1 )
    {
        printf( "Node %s is not among", Abc_ObjName(pNodeIn) );
        printf( " the fanins of node %s...\n", Abc_ObjName(pNodeOut) );
        return NULL;
    }
    // create the new node
    pNodeNew = Abc_NtkCreateObj( pNodeIn->pNtk, Type );
    // add pNodeIn as fanin and pNodeOut as fanout
    Vec_IntPushMem( pNodeNew->pNtk->pMmStep, &pNodeNew->vFanins,  pNodeIn->Id  );
    Vec_IntPushMem( pNodeNew->pNtk->pMmStep, &pNodeNew->vFanouts, pNodeOut->Id );
    // update the fanout of pNodeIn
    Vec_IntWriteEntry( &pNodeIn->vFanouts, iFanoutIndex, pNodeNew->Id );
    // update the fanin of pNodeOut
    Vec_IntWriteEntry( &pNodeOut->vFanins, iFaninIndex, pNodeNew->Id );
    return pNodeNew;
}